

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

uint64_t cptr_el2_read(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri)

{
  ulong uVar1;
  bool bVar2;
  
  uVar1 = (env->cp15).cptr_el[2];
  if ((env->features & 0x210000000) == 0x200000000) {
    if (env->aarch64 == 0) {
      bVar2 = (env->uncached_cpsr & 0x1f) == 0x16;
    }
    else {
      bVar2 = (~env->pstate & 0xc) == 0;
    }
    if (!bVar2) {
      bVar2 = ((env->cp15).scr_el3 & 1) == 0;
    }
    if ((!bVar2) && (((env->cp15).nsacr & 0x400) == 0)) {
      uVar1 = uVar1 | 0xc00;
    }
  }
  return uVar1;
}

Assistant:

static uint64_t cptr_el2_read(CPUARMState *env, const ARMCPRegInfo *ri)
{
    /*
     * For A-profile AArch32 EL3, if NSACR.CP10
     * is 0 then HCPTR.{TCP11,TCP10} ignore writes and read as 1.
     */
    uint64_t value = env->cp15.cptr_el[2];

    if (arm_feature(env, ARM_FEATURE_EL3) && !arm_el_is_aa64(env, 3) &&
        !arm_is_secure(env) && !extract32(env->cp15.nsacr, 10, 1)) {
        value |= 0x3 << 10;
    }
    return value;
}